

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5DecodeRowidList(int *pRc,Fts5Buffer *pBuf,u8 *pData,int nData)

{
  byte bVar1;
  int iVar2;
  u64 in_RAX;
  long lVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  u64 iVal;
  u64 local_38;
  
  if (0 < nData) {
    lVar6 = 0;
    iVar2 = 0;
    local_38 = in_RAX;
    do {
      bVar1 = sqlite3Fts5GetVarint(pData + iVar2,&local_38);
      iVar4 = iVar2 + (uint)bVar1;
      if ((iVar4 < nData) && (pData[iVar4] == '\0')) {
        lVar3 = (long)iVar4 + 1;
        iVar2 = (int)lVar3;
        if (iVar2 < nData) {
          iVar4 = iVar4 + 2;
          if (pData[lVar3] != '\0') {
            iVar4 = iVar2;
          }
          iVar2 = iVar4;
          pcVar5 = "*";
          if (pData[lVar3] == '\0') {
            pcVar5 = "+";
          }
        }
        else {
          pcVar5 = "*";
        }
      }
      else {
        pcVar5 = "";
        iVar2 = iVar4;
      }
      lVar6 = lVar6 + local_38;
      sqlite3Fts5BufferAppendPrintf(pRc,pBuf," %lld%s",lVar6,pcVar5);
    } while (iVar2 < nData);
  }
  return;
}

Assistant:

static void fts5DecodeRowidList(
  int *pRc,                       /* IN/OUT: Error code */
  Fts5Buffer *pBuf,               /* Buffer to append text to */
  const u8 *pData, int nData      /* Data to decode list-of-rowids from */
){
  int i = 0;
  i64 iRowid = 0;

  while( i<nData ){
    const char *zApp = "";
    u64 iVal;
    i += sqlite3Fts5GetVarint(&pData[i], &iVal);
    iRowid += iVal;

    if( i<nData && pData[i]==0x00 ){
      i++;
      if( i<nData && pData[i]==0x00 ){
        i++;
        zApp = "+";
      }else{
        zApp = "*";
      }
    }

    sqlite3Fts5BufferAppendPrintf(pRc, pBuf, " %lld%s", iRowid, zApp);
  }
}